

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TempInputScalar
               (ImRect *bb,ImGuiID id,char *label,ImGuiDataType data_type,void *p_data,char *format)

{
  byte bVar1;
  ImRect *bb_00;
  undefined4 in_ECX;
  undefined8 in_RDX;
  ImGuiID in_ESI;
  char *in_RDI;
  char *in_R8;
  bool value_changed;
  ImGuiInputTextFlags flags;
  char data_buf [32];
  char fmt_buf [32];
  ImGuiContext *g;
  void *in_stack_ffffffffffffff78;
  ImGuiDataType in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  ImGuiInputTextFlags in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  ImGuiContext *pIVar2;
  ImGuiID id_00;
  undefined4 in_stack_ffffffffffffffe0;
  ImGuiDataType data_type_00;
  undefined4 in_stack_fffffffffffffff0;
  
  data_type_00 = (ImGuiDataType)((ulong)in_RDX >> 0x20);
  pIVar2 = GImGui;
  bb_00 = (ImRect *)
          ImParseFormatTrimDecorations
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  id_00 = (ImGuiID)((ulong)pIVar2 >> 0x20);
  DataTypeFormatString
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78,(char *)0x46ff2b);
  ImStrTrimBlanks(in_stack_ffffffffffffff90);
  bVar1 = TempInputText(bb_00,id_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                        in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  if (((bool)bVar1) &&
     (bVar1 = DataTypeApplyOpFromText
                        (in_RDI,(char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),data_type_00,
                         (void *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8), (bool)bVar1)) {
    MarkItemEdited(in_ESI);
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool ImGui::TempInputScalar(const ImRect& bb, ImGuiID id, const char* label, ImGuiDataType data_type, void* p_data, const char* format)
{
    ImGuiContext& g = *GImGui;

    char fmt_buf[32];
    char data_buf[32];
    format = ImParseFormatTrimDecorations(format, fmt_buf, IM_ARRAYSIZE(fmt_buf));
    DataTypeFormatString(data_buf, IM_ARRAYSIZE(data_buf), data_type, p_data, format);
    ImStrTrimBlanks(data_buf);

    ImGuiInputTextFlags flags = ImGuiInputTextFlags_AutoSelectAll | ImGuiInputTextFlags_NoMarkEdited;
    flags |= ((data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double) ? ImGuiInputTextFlags_CharsScientific : ImGuiInputTextFlags_CharsDecimal);
    bool value_changed = TempInputText(bb, id, label, data_buf, IM_ARRAYSIZE(data_buf), flags);
    if (value_changed)
    {
        value_changed = DataTypeApplyOpFromText(data_buf, g.InputTextState.InitialTextA.Data, data_type, p_data, NULL);
        if (value_changed)
            MarkItemEdited(id);
    }
    return value_changed;
}